

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
* __thiscall
kratos::Port::connected_to
          (unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
           *__return_storage_ptr__,Port *this)

{
  Var *root;
  bool bVar1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *this_00;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  Var **ppVVar2;
  __node_base_ptr *this_03;
  __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_04;
  element_type *peVar3;
  value_type *p;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
  *__range2;
  unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
  *ports;
  PortVisitor v;
  Var *sinks;
  value_type *stmt;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range1;
  Port *this_local;
  unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
  *result;
  
  std::
  unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
  ::unordered_set(__return_storage_ptr__);
  if (this->direction_ != In) {
    this_00 = &(this->super_Var).sinks_;
    __end1 = std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin(this_00);
    stmt = (value_type *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::end(this_00);
    while (bVar1 = std::__detail::operator!=
                             (&__end1.
                               super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                              ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                               &stmt), bVar1) {
      this_01 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )std::__detail::
                 _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                           (&__end1);
      this_02 = std::
                __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_01);
      ppVVar2 = AssignStmt::left(this_02);
      root = *ppVVar2;
      PortVisitor::PortVisitor((PortVisitor *)&ports);
      IRVisitor::visit_root((IRVisitor *)&ports,&root->super_IRNode);
      this_03 = &v.super_IRVisitor.visited_._M_h._M_single_bucket;
      __end2 = std::
               unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
               ::begin((unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
                        *)this_03);
      p = (value_type *)
          std::
          unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
          ::end((unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
                 *)this_03);
      while (bVar1 = std::__detail::operator!=
                               (&__end2.
                                 super__Node_iterator_base<std::shared_ptr<kratos::Port>,_false>,
                                (_Node_iterator_base<std::shared_ptr<kratos::Port>,_false> *)&p),
            bVar1) {
        this_04 = (__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::__detail::_Node_const_iterator<std::shared_ptr<kratos::Port>,_true,_false>::
                  operator*(&__end2);
        peVar3 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_04);
        if ((peVar3->direction_ == In) &&
           (peVar3 = std::
                     __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(this_04),
           (peVar3->super_Var).generator_ != (this->super_Var).generator_)) {
          std::
          unordered_set<std::shared_ptr<kratos::Port>,std::hash<std::shared_ptr<kratos::Port>>,std::equal_to<std::shared_ptr<kratos::Port>>,std::allocator<std::shared_ptr<kratos::Port>>>
          ::emplace<std::shared_ptr<kratos::Port>const&>
                    ((unordered_set<std::shared_ptr<kratos::Port>,std::hash<std::shared_ptr<kratos::Port>>,std::equal_to<std::shared_ptr<kratos::Port>>,std::allocator<std::shared_ptr<kratos::Port>>>
                      *)__return_storage_ptr__,(shared_ptr<kratos::Port> *)this_04);
        }
        std::__detail::_Node_const_iterator<std::shared_ptr<kratos::Port>,_true,_false>::operator++
                  (&__end2);
      }
      PortVisitor::~PortVisitor((PortVisitor *)&ports);
      std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
      operator++(&__end1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<std::shared_ptr<Port>> Port::connected_to() const {
    std::unordered_set<std::shared_ptr<Port>> result;
    if (direction_ == PortDirection::In) return result;
    for (auto const& stmt : sinks_) {
        auto* const sinks = stmt->left();
        PortVisitor v;
        v.visit_root(sinks);
        auto const& ports = v.ports;
        for (auto const& p : ports) {
            if (p->direction_ == PortDirection::In && p->generator_ != generator_) {
                result.emplace(p);
            }
        }
    }
    return result;
}